

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt.c
# Opt level: O3

CURLcode mqtt_do(Curl_easy *data,_Bool *done)

{
  char *pcVar1;
  curl_trc_feat *pcVar2;
  bool bVar3;
  CURLcode CVar4;
  connectdata *conn;
  char *buf;
  size_t sVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  char *__s;
  char *pcVar10;
  bool bVar11;
  char remain [4];
  char client_id [13];
  byte local_5c [4];
  undefined1 local_58 [5];
  undefined3 uStack_53;
  undefined4 uStack_50;
  undefined1 uStack_4c;
  ulong local_48;
  size_t local_40;
  size_t local_38;
  
  *done = false;
  local_5c[0] = 0;
  local_5c[1] = 0;
  local_5c[2] = 0;
  local_5c[3] = 0;
  uStack_50 = 0;
  uStack_4c = 0;
  local_58 = (undefined1  [5])0x6c727563;
  uStack_53 = 0;
  pcVar10 = (data->state).aptr.user;
  if (pcVar10 == (char *)0x0) {
    pcVar10 = "";
  }
  local_38 = strlen(pcVar10);
  __s = (data->state).aptr.passwd;
  if (__s == (char *)0x0) {
    __s = "";
  }
  local_40 = strlen(__s);
  lVar9 = local_40 + local_38 + (ulong)(local_38 != 0) * 2;
  bVar11 = local_40 != 0;
  uVar7 = 0;
  uVar6 = lVar9 + (ulong)bVar11 * 2 + 0x18;
  uVar8 = uVar7;
  if (uVar6 != 0) {
    do {
      local_58[uVar8 - 4] = (0x7f < uVar6) << 7 | (byte)uVar6 & 0x7f;
      uVar7 = uVar8 + 1;
      if (2 < uVar8) break;
      bVar3 = 0x7f < uVar6;
      uVar6 = uVar6 >> 7;
      uVar8 = uVar7;
    } while (bVar3);
  }
  uVar7 = uVar7 & 0xffffffff;
  uVar6 = lVar9 + (ulong)bVar11 * 2 + uVar7 + 0x19;
  CVar4 = CURLE_WEIRD_SERVER_REPLY;
  if (0xfffffff < uVar6) goto LAB_001416dc;
  buf = (char *)(*Curl_cmalloc)(uVar6);
  if (buf == (char *)0x0) {
    CVar4 = CURLE_OUT_OF_MEMORY;
    goto LAB_001416dc;
  }
  local_48 = uVar6;
  memset(buf,0,uVar6);
  *buf = '\x10';
  memcpy(buf + 1,local_5c,uVar7);
  pcVar1 = buf + uVar7 + 1;
  pcVar1[0] = '\0';
  pcVar1[1] = '\x04';
  pcVar1[2] = 'M';
  pcVar1[3] = 'Q';
  pcVar1[4] = 'T';
  pcVar1[5] = 'T';
  pcVar1[6] = '\x04';
  pcVar1[7] = '\x02';
  (buf + uVar7 + 9)[0] = '\0';
  (buf + uVar7 + 9)[1] = '<';
  CVar4 = Curl_rand_alnum(data,local_58 + 4,9);
  sVar5 = strlen(local_58);
  if (sVar5 == 0xc) {
    (buf + uVar7 + 0xb)[0] = '\0';
    (buf + uVar7 + 0xb)[1] = '\f';
    *(ulong *)(buf + uVar7 + 0xd) = CONCAT35(uStack_53,local_58);
    *(undefined4 *)(buf + uVar7 + 0x15) = uStack_50;
    if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
       ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level)))) {
      Curl_infof(data,"Using client id \'%s\'",local_58);
    }
    lVar9 = local_38 + uVar7 + 0x19;
    if (local_38 == 0) {
LAB_0014163c:
      if (local_40 != 0) {
        if (0xffff < local_40) {
          pcVar10 = "Password is too large: [%zu]";
          goto LAB_00141656;
        }
        buf[uVar7 + 8] = buf[uVar7 + 8] | 0x40;
        buf[lVar9] = (char)(local_40 >> 8);
        buf[lVar9 + 1] = (char)local_40;
        memcpy(buf + lVar9 + 2,__s,local_40);
      }
      if (CVar4 == CURLE_OK) {
        CVar4 = mqtt_send(data,buf,local_48);
      }
    }
    else {
      if (local_38 < 0x10000) {
        buf[uVar7 + 8] = buf[uVar7 + 8] | 0x80;
        lVar9 = local_38 + uVar7 + 0x1b;
        buf[uVar7 + 0x19] = (char)(local_38 >> 8);
        buf[uVar7 + 0x1a] = (char)local_38;
        memcpy(buf + uVar7 + 0x1b,pcVar10,local_38);
        goto LAB_0014163c;
      }
      pcVar10 = "Username is too large: [%zu]";
LAB_00141656:
      Curl_failf(data,pcVar10);
      CVar4 = CURLE_WEIRD_SERVER_REPLY;
    }
  }
  else {
    Curl_failf(data,"Client ID length mismatched: [%zu]",sVar5);
    CVar4 = CURLE_WEIRD_SERVER_REPLY;
  }
  (*Curl_cfree)(buf);
  (*Curl_cfree)((data->state).aptr.user);
  (data->state).aptr.user = (char *)0x0;
  (*Curl_cfree)((data->state).aptr.passwd);
  (data->state).aptr.passwd = (char *)0x0;
  if (CVar4 == CURLE_OK) {
    (data->conn->proto).ftpc.pp.nread_resp = 0x200000000;
    return CURLE_OK;
  }
LAB_001416dc:
  Curl_failf(data,"Error %d sending MQTT CONNECT request",(ulong)CVar4);
  return CVar4;
}

Assistant:

static CURLcode mqtt_do(struct Curl_easy *data, bool *done)
{
  CURLcode result = CURLE_OK;
  *done = FALSE; /* unconditionally */

  result = mqtt_connect(data);
  if(result) {
    failf(data, "Error %d sending MQTT CONNECT request", result);
    return result;
  }
  mqstate(data, MQTT_FIRST, MQTT_CONNACK);
  return CURLE_OK;
}